

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackFrame.c
# Opt level: O0

void sysbvm_stackFrame_prepareUnwindingUntil(sysbvm_stackFrameRecord_t *targetRecord)

{
  long *in_FS_OFFSET;
  sysbvm_stackFrameRecord_t *local_18;
  sysbvm_stackFrameRecord_t *position;
  sysbvm_stackFrameRecord_t *targetRecord_local;
  
  for (local_18 = *(sysbvm_stackFrameRecord_t **)(*in_FS_OFFSET + -0x10);
      (local_18 != (sysbvm_stackFrameRecord_t *)0x0 &&
      (sysbvm_stackFrame_prepareUnwinding(targetRecord), local_18 != targetRecord));
      local_18 = local_18->previous) {
  }
  return;
}

Assistant:

static void sysbvm_stackFrame_prepareUnwindingUntil(sysbvm_stackFrameRecord_t *targetRecord)
{
    for(sysbvm_stackFrameRecord_t *position = sysbvm_stackFrame_activeRecord; position; position = position->previous)
    {
        sysbvm_stackFrame_prepareUnwinding(targetRecord);
        if(position == targetRecord)
            return;
    }
}